

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O2

void __thiscall prevector_tests::prevector_tester<8U,_int>::move(prevector_tester<8U,_int> *this)

{
  long lVar1;
  pointer piVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->real_vector,&this->real_vector_alt);
  piVar2 = (this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  prevector<8U,_int,_unsigned_int,_int>::operator=(&this->pre_vector,&this->pre_vector_alt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    prevector<8U,_int,_unsigned_int,_int>::clear(&this->pre_vector_alt);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void move() {
        real_vector = std::move(real_vector_alt);
        real_vector_alt.clear();
        pre_vector = std::move(pre_vector_alt);
        pre_vector_alt.clear();
    }